

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_transcode.cpp
# Opt level: O1

ktx_error_code_e
ktxTexture2_TranscodeBasis
          (ktxTexture2 *This,ktx_transcode_fmt_e outputFormat,ktx_transcode_flags transcodeFlags)

{
  ktx_uint32_t *pkVar1;
  ktxTexture2_private *pkVar2;
  ktxTexture_protected *pkVar3;
  ktxTexture_protected *pkVar4;
  ktxTexture2_private *pkVar5;
  ktx_uint8_t *__ptr;
  uint uVar6;
  ktxFormatSizeFlags kVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  ktx_bool_t kVar12;
  uint uVar13;
  ktx_error_code_e kVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  ktxTexture2 *prototype;
  ktx_uint32_t local_70;
  alpha_content_e local_6c;
  ktxTexture2 *local_68;
  ktxTextureCreateInfo local_60;
  
  pkVar1 = This->pDfd;
  uVar16 = pkVar1[3] & 0xff;
  if ((uVar16 != 0xa6) && (This->supercompressionScheme != KTX_SS_BASIS_LZ)) {
    return KTX_INVALID_OPERATION;
  }
  pkVar2 = This->_private;
  if (This->supercompressionScheme == KTX_SS_BASIS_LZ) {
    if (pkVar2->_supercompressionGlobalData == (ktx_uint8_t *)0x0) {
      return KTX_INVALID_OPERATION;
    }
    if (pkVar2->_sgdByteLength == 0) {
      return KTX_INVALID_OPERATION;
    }
  }
  if ((transcodeFlags & 2) != 0) {
    basisu::debug_printf
              ("ktxTexture_TranscodeBasis: KTX_TF_PVRTC_DECODE_TO_NEXT_POW2 currently unsupported\n"
              );
    return KTX_UNSUPPORTED_FEATURE;
  }
  if (((outputFormat & ~KTX_TTF_ETC2_RGBA) == KTX_TF_PVRTC1_4_OPAQUE_ONLY) &&
     ((uVar13 = This->baseWidth - 1, (This->baseWidth ^ uVar13) <= uVar13 ||
      (uVar13 = This->baseHeight - 1, (This->baseHeight ^ uVar13) <= uVar13)))) {
    basisu::debug_printf("ktxTexture_TranscodeBasis: PVRTC1 only supports power of 2 dimensions\n");
    return KTX_INVALID_OPERATION;
  }
  if (uVar16 == 0xa3) {
    local_6c = eNone;
    if (((pkVar1[2] >> 0x12) - 6 & 0xfffffffc) == 8) {
      bVar15 = *(byte *)((long)pkVar1 + 0x2f) & 0xf;
      if (bVar15 == 0xf) {
        bVar11 = true;
        local_6c = eAlpha;
      }
      else {
        local_6c = eNone;
        bVar11 = false;
        if (bVar15 == 4) {
          bVar11 = true;
          local_6c = eGreen;
        }
      }
      if (!bVar11) {
        return KTX_FILE_DATA_ERROR;
      }
    }
  }
  else {
    bVar15 = *(byte *)((long)pkVar1 + 0x1f) & 0xf;
    local_6c = eAlpha;
    if (bVar15 != 3) {
      local_6c = (uint)(bVar15 == 5) * 2;
    }
  }
  if ((int)outputFormat < 0x16) {
    if (outputFormat == KTX_TTF_PVRTC1_4_RGBA) {
      iVar17 = 9;
    }
    else {
      if (outputFormat != KTX_TTF_PVRTC2_4_RGBA) goto LAB_0013467e;
      iVar17 = 0x13;
    }
LAB_0013466c:
    outputFormat = iVar17 - (uint)(local_6c == eNone);
  }
  else if (outputFormat == KTX_TF_ETC2) {
    outputFormat = (ktx_transcode_fmt_e)(local_6c != eNone);
  }
  else if (outputFormat == KTX_TTF_BC1_OR_3) {
    iVar17 = 3;
    goto LAB_0013466c;
  }
LAB_0013467e:
  if (KTX_TTF_ETC2_EAC_RG11 < outputFormat) {
    return KTX_INVALID_VALUE;
  }
  uVar13 = pkVar1[3] & 0xff0000;
  switch(outputFormat) {
  case KTX_TF_ETC1:
    local_70 = (uVar13 == 0x20000) + 0x93;
    break;
  case KTX_TTF_ETC2_RGBA:
    local_70 = (uVar13 == 0x20000) + 0x97;
    break;
  case KTX_TF_BC1:
    local_70 = (uVar13 == 0x20000) + 0x83;
    break;
  case KTX_TF_BC3:
    local_70 = (uVar13 == 0x20000) + 0x89;
    break;
  case KTX_TF_BC4:
    local_70 = 0x8b;
    break;
  case KTX_TF_BC5:
    local_70 = 0x8d;
    break;
  case KTX_TF_BC7_M6_OPAQUE_ONLY:
    local_70 = (uVar13 == 0x20000) + 0x91;
    break;
  default:
    return KTX_INVALID_VALUE;
  case KTX_TF_PVRTC1_4_OPAQUE_ONLY:
  case KTX_TTF_PVRTC1_4_RGBA:
    local_70 = (uint)(uVar13 == 0x20000) * 4 + 0x3b9b9cf1;
    break;
  case KTX_TTF_ASTC_4x4_RGBA:
    local_70 = (uVar13 == 0x20000) + 0x9d;
    break;
  case KTX_TTF_RGBA32:
    local_70 = 0x25;
    if (uVar13 == 0x20000) {
      local_70 = 0x2b;
    }
    break;
  case KTX_TTF_RGB565:
    local_70 = 4;
    break;
  case KTX_TTF_BGR565:
    local_70 = 5;
    break;
  case KTX_TTF_RGBA4444:
    local_70 = 2;
    break;
  case KTX_TTF_PVRTC2_4_RGB:
  case KTX_TTF_PVRTC2_4_RGBA:
    local_70 = (uint)(uVar13 == 0x20000) * 4 + 0x3b9b9cf3;
    break;
  case KTX_TTF_ETC2_EAC_R11:
    local_70 = 0x99;
    break;
  case KTX_TTF_ETC2_EAC_RG11:
    local_70 = 0x9b;
  }
  bVar11 = basist::basis_is_format_supported(outputFormat,(uint)(uVar16 == 0xa6));
  if (!bVar11) {
    return KTX_UNSUPPORTED_FEATURE;
  }
  local_60.glInternalformat = 0;
  local_60.vkFormat = local_70;
  local_60.baseWidth = This->baseWidth;
  local_60.baseHeight = This->baseHeight;
  local_60.baseDepth = This->baseDepth;
  local_60.generateMipmaps = This->generateMipmaps;
  local_60.isArray = This->isArray;
  local_60.numDimensions = This->numDimensions;
  local_60.numLevels = This->numLevels;
  local_60.numLayers = This->numLayers;
  local_60.numFaces = This->numFaces;
  local_60.pDfd = (ktx_uint32_t *)0x0;
  kVar14 = ktxTexture2_Create(&local_60,KTX_TEXTURE_CREATE_ALLOC_STORAGE,&local_68);
  if (kVar14 != KTX_SUCCESS) {
    if (kVar14 == KTX_OUT_OF_MEMORY) {
      return KTX_OUT_OF_MEMORY;
    }
    __assert_fail("result == KTX_OUT_OF_MEMORY",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_transcode.cpp"
                  ,0x139,
                  "ktx_error_code_e ktxTexture2_TranscodeBasis(ktxTexture2 *, ktx_transcode_fmt_e, ktx_transcode_flags)"
                 );
  }
  if (This->pData == (ktx_uint8_t *)0x0) {
    kVar12 = ktxTexture_isActiveStream((ktxTexture *)This);
    kVar14 = KTX_INVALID_OPERATION;
    if ((!kVar12) ||
       (kVar14 = ktxTexture2_LoadImageData(This,(ktx_uint8_t *)0x0,0), kVar14 != KTX_SUCCESS))
    goto LAB_001349a5;
  }
  if (ktxTexture2_TranscodeBasis::transcoderInitialized == '\0') {
    basist::basisu_transcoder_init();
    ktxTexture2_TranscodeBasis::transcoderInitialized = '\x01';
  }
  if (uVar16 == 0xa6) {
    kVar14 = ktxTexture2_transcodeUastc(This,local_6c,local_68,outputFormat,transcodeFlags);
  }
  else {
    kVar14 = ktxTexture2_transcodeLzEtc1s(This,local_6c,local_68,outputFormat,transcodeFlags);
  }
  if (kVar14 == KTX_SUCCESS) {
    pkVar3 = This->_protected;
    pkVar4 = local_68->_protected;
    pkVar5 = local_68->_private;
    kVar7 = (pkVar4->_formatSize).flags;
    uVar8 = (pkVar4->_formatSize).paletteSizeInBits;
    uVar9 = (pkVar4->_formatSize).blockSizeInBits;
    uVar10 = (pkVar4->_formatSize).blockWidth;
    uVar16 = (pkVar4->_formatSize).blockDepth;
    uVar13 = (pkVar4->_formatSize).minBlocksX;
    uVar6 = (pkVar4->_formatSize).minBlocksY;
    (pkVar3->_formatSize).blockHeight = (pkVar4->_formatSize).blockHeight;
    (pkVar3->_formatSize).blockDepth = uVar16;
    (pkVar3->_formatSize).minBlocksX = uVar13;
    (pkVar3->_formatSize).minBlocksY = uVar6;
    (pkVar3->_formatSize).flags = kVar7;
    (pkVar3->_formatSize).paletteSizeInBits = uVar8;
    (pkVar3->_formatSize).blockSizeInBits = uVar9;
    (pkVar3->_formatSize).blockWidth = uVar10;
    This->vkFormat = local_70;
    This->isCompressed = local_68->isCompressed;
    This->supercompressionScheme = KTX_SS_BEGIN_RANGE;
    pkVar2->_requiredLevelAlignment = pkVar5->_requiredLevelAlignment;
    memcpy(pkVar2->_levelIndex,pkVar5->_levelIndex,(ulong)This->numLevels * 0x18);
    free(This->pDfd);
    This->pDfd = local_68->pDfd;
    local_68->pDfd = (ktx_uint32_t *)0x0;
    free(This->pData);
    This->pData = local_68->pData;
    This->dataSize = local_68->dataSize;
    local_68->dataSize = 0;
    local_68->pData = (ktx_uint8_t *)0x0;
    pkVar2 = This->_private;
    pkVar2->_sgdByteLength = 0;
    __ptr = pkVar2->_supercompressionGlobalData;
    if (__ptr != (ktx_uint8_t *)0x0) {
      free(__ptr);
      This->_private->_supercompressionGlobalData = (ktx_uint8_t *)0x0;
    }
  }
LAB_001349a5:
  ktxTexture2_Destroy(local_68);
  return kVar14;
}

Assistant:

KTX_error_code
 ktxTexture2_TranscodeBasis(ktxTexture2* This,
                            ktx_transcode_fmt_e outputFormat,
                            ktx_transcode_flags transcodeFlags)
{
    uint32_t* BDB = This->pDfd + 1;
    khr_df_model_e colorModel = (khr_df_model_e)KHR_DFDVAL(BDB, MODEL);
    if (colorModel != KHR_DF_MODEL_UASTC
        // Constructor has checked color model matches BASIS_LZ.
        && This->supercompressionScheme != KTX_SS_BASIS_LZ)
    {
        return KTX_INVALID_OPERATION; // Not in a transcodable format.
    }

    DECLARE_PRIVATE(priv, This);
    if (This->supercompressionScheme == KTX_SS_BASIS_LZ) {
        if (!priv._supercompressionGlobalData || priv._sgdByteLength == 0)
            return KTX_INVALID_OPERATION;
    }

    if (transcodeFlags & KTX_TF_PVRTC_DECODE_TO_NEXT_POW2) {
         debug_printf("ktxTexture_TranscodeBasis: KTX_TF_PVRTC_DECODE_TO_NEXT_POW2 currently unsupported\n");
         return KTX_UNSUPPORTED_FEATURE;
    }

    if (outputFormat == KTX_TTF_PVRTC1_4_RGB
        || outputFormat == KTX_TTF_PVRTC1_4_RGBA) {
         if ((!isPow2(This->baseWidth)) || (!isPow2(This->baseHeight))) {
             debug_printf("ktxTexture_TranscodeBasis: PVRTC1 only supports power of 2 dimensions\n");
             return KTX_INVALID_OPERATION;
        }
    }

    const bool srgb = (KHR_DFDVAL(BDB, TRANSFER) == KHR_DF_TRANSFER_SRGB);
    alpha_content_e alphaContent = eNone;
    if (colorModel == KHR_DF_MODEL_ETC1S) {
        if (KHR_DFDSAMPLECOUNT(BDB) == 2) {
            uint32_t channelId = KHR_DFDSVAL(BDB, 1, CHANNELID);
            if (channelId == KHR_DF_CHANNEL_ETC1S_AAA) {
                alphaContent = eAlpha;
            } else if (channelId == KHR_DF_CHANNEL_ETC1S_GGG){
                alphaContent = eGreen;
            } else {
                return KTX_FILE_DATA_ERROR;
            }
        }
    } else {
        uint32_t channelId = KHR_DFDSVAL(BDB, 0, CHANNELID);
        if (channelId == KHR_DF_CHANNEL_UASTC_RGBA)
            alphaContent = eAlpha;
        else if (channelId == KHR_DF_CHANNEL_UASTC_RRRG)
            alphaContent = eGreen;
    }

    VkFormat vkFormat;

    // Do some format mapping.
    switch (outputFormat) {
      case KTX_TTF_BC1_OR_3:
        outputFormat = alphaContent != eNone ? KTX_TTF_BC3_RGBA
                                             : KTX_TTF_BC1_RGB;
        break;
      case KTX_TTF_ETC:
        outputFormat = alphaContent != eNone ? KTX_TTF_ETC2_RGBA
                                             : KTX_TTF_ETC1_RGB;
        break;
      case KTX_TTF_PVRTC1_4_RGBA:
        // This transcoder does not write opaque alpha blocks.
        outputFormat = alphaContent != eNone  ? KTX_TTF_PVRTC1_4_RGBA
                                              : KTX_TTF_PVRTC1_4_RGB;
        break;
      case KTX_TTF_PVRTC2_4_RGBA:
        // This transcoder does not write opaque alpha blocks.
        outputFormat = alphaContent != eNone ? KTX_TTF_PVRTC2_4_RGBA
                                              : KTX_TTF_PVRTC2_4_RGB;
        break;
      default:
        /*NOP*/;
    }

    switch (outputFormat) {
      case KTX_TTF_ETC1_RGB:
        vkFormat = srgb ? VK_FORMAT_ETC2_R8G8B8_SRGB_BLOCK
                        : VK_FORMAT_ETC2_R8G8B8_UNORM_BLOCK;
        break;
      case KTX_TTF_ETC2_RGBA:
        vkFormat = srgb ? VK_FORMAT_ETC2_R8G8B8A8_SRGB_BLOCK
                        : VK_FORMAT_ETC2_R8G8B8A8_UNORM_BLOCK;
        break;
      case KTX_TTF_ETC2_EAC_R11:
        vkFormat = VK_FORMAT_EAC_R11_UNORM_BLOCK;
        break;
      case KTX_TTF_ETC2_EAC_RG11:
        vkFormat = VK_FORMAT_EAC_R11G11_UNORM_BLOCK;
        break;
      case KTX_TTF_BC1_RGB:
        // Transcoding doesn't support BC1 alpha.
        vkFormat = srgb ? VK_FORMAT_BC1_RGB_SRGB_BLOCK
                        : VK_FORMAT_BC1_RGB_UNORM_BLOCK;
        break;
      case KTX_TTF_BC3_RGBA:
        vkFormat = srgb ? VK_FORMAT_BC3_SRGB_BLOCK
                        : VK_FORMAT_BC3_UNORM_BLOCK;
        break;
      case KTX_TTF_BC4_R:
        vkFormat = VK_FORMAT_BC4_UNORM_BLOCK;
        break;
      case KTX_TTF_BC5_RG:
        vkFormat = VK_FORMAT_BC5_UNORM_BLOCK;
        break;
      case KTX_TTF_PVRTC1_4_RGB:
      case KTX_TTF_PVRTC1_4_RGBA:
        vkFormat = srgb ? VK_FORMAT_PVRTC1_4BPP_SRGB_BLOCK_IMG
                        : VK_FORMAT_PVRTC1_4BPP_UNORM_BLOCK_IMG;
        break;
      case KTX_TTF_PVRTC2_4_RGB:
      case KTX_TTF_PVRTC2_4_RGBA:
        vkFormat = srgb ? VK_FORMAT_PVRTC2_4BPP_SRGB_BLOCK_IMG
                        : VK_FORMAT_PVRTC2_4BPP_UNORM_BLOCK_IMG;
        break;
      case KTX_TTF_BC7_RGBA:
        vkFormat = srgb ? VK_FORMAT_BC7_SRGB_BLOCK
                        : VK_FORMAT_BC7_UNORM_BLOCK;
        break;
      case KTX_TTF_ASTC_4x4_RGBA:
        vkFormat = srgb ? VK_FORMAT_ASTC_4x4_SRGB_BLOCK
                        : VK_FORMAT_ASTC_4x4_UNORM_BLOCK;
        break;
      case KTX_TTF_RGB565:
        vkFormat = VK_FORMAT_R5G6B5_UNORM_PACK16;
        break;
      case KTX_TTF_BGR565:
        vkFormat = VK_FORMAT_B5G6R5_UNORM_PACK16;
        break;
      case KTX_TTF_RGBA4444:
        vkFormat = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
        break;
      case KTX_TTF_RGBA32:
        vkFormat = srgb ? VK_FORMAT_R8G8B8A8_SRGB
                        : VK_FORMAT_R8G8B8A8_UNORM;
        break;
      default:
        return KTX_INVALID_VALUE;
    }

    basis_tex_format textureFormat;
    if (colorModel == KHR_DF_MODEL_UASTC)
        textureFormat = basis_tex_format::cUASTC4x4;
    else
        textureFormat = basis_tex_format::cETC1S;

    if (!basis_is_format_supported((transcoder_texture_format)outputFormat,
                                    textureFormat)) {
        return KTX_UNSUPPORTED_FEATURE;
    }


    // Create a prototype texture to use for calculating sizes in the target
    // format and, as useful side effects, provide us with a properly sized
    // data allocation and the DFD for the target format.
    ktxTextureCreateInfo createInfo;
    createInfo.glInternalformat = 0;
    createInfo.vkFormat = vkFormat;
    createInfo.baseWidth = This->baseWidth;
    createInfo.baseHeight = This->baseHeight;
    createInfo.baseDepth = This->baseDepth;
    createInfo.generateMipmaps = This->generateMipmaps;
    createInfo.isArray = This->isArray;
    createInfo.numDimensions = This->numDimensions;
    createInfo.numFaces = This->numFaces;
    createInfo.numLayers = This->numLayers;
    createInfo.numLevels = This->numLevels;
    createInfo.pDfd = nullptr;

    KTX_error_code result;
    ktxTexture2* prototype;
    result = ktxTexture2_Create(&createInfo, KTX_TEXTURE_CREATE_ALLOC_STORAGE,
                                &prototype);

    if (result != KTX_SUCCESS) {
        assert(result == KTX_OUT_OF_MEMORY); // The only run time error
        return result;
    }

    if (!This->pData) {
        if (ktxTexture_isActiveStream((ktxTexture*)This)) {
             // Load pending. Complete it.
            result = ktxTexture2_LoadImageData(This, NULL, 0);
            if (result != KTX_SUCCESS)
            {
                ktxTexture2_Destroy(prototype);
                return result;
            }
        } else {
            // No data to transcode.
            ktxTexture2_Destroy(prototype);
            return KTX_INVALID_OPERATION;
        }
    }

    // Transcoder global initialization. Requires ~9 milliseconds when compiled
    // and executed natively on a Core i7 2.2 GHz. If this is too slow, the
    // tables it computes can easily be moved to be compiled in.
    static bool transcoderInitialized;
    if (!transcoderInitialized) {
        basisu_transcoder_init();
        transcoderInitialized = true;
    }

    if (textureFormat == basis_tex_format::cETC1S) {
        result = ktxTexture2_transcodeLzEtc1s(This, alphaContent,
                                            prototype, outputFormat,
                                            transcodeFlags);
    } else {
        result = ktxTexture2_transcodeUastc(This, alphaContent,
                                            prototype, outputFormat,
                                            transcodeFlags);
    }

    if (result == KTX_SUCCESS) {
        // Fix up the current texture
        DECLARE_PROTECTED(thisPrtctd, This);
        DECLARE_PRIVATE(protoPriv, prototype);
        DECLARE_PROTECTED(protoPrtctd, prototype);
        memcpy(&thisPrtctd._formatSize, &protoPrtctd._formatSize,
               sizeof(ktxFormatSize));
        This->vkFormat = vkFormat;
        This->isCompressed = prototype->isCompressed;
        This->supercompressionScheme = KTX_SS_NONE;
        priv._requiredLevelAlignment = protoPriv._requiredLevelAlignment;
        // Copy the levelIndex from the prototype to This.
        memcpy(priv._levelIndex, protoPriv._levelIndex,
               This->numLevels * sizeof(ktxLevelIndexEntry));
        // Move the DFD and data from the prototype to This.
        free(This->pDfd);
        This->pDfd = prototype->pDfd;
        prototype->pDfd = 0;
        free(This->pData);
        This->pData = prototype->pData;
        This->dataSize = prototype->dataSize;
        prototype->pData = 0;
        prototype->dataSize = 0;
        // Free SGD data
        This->_private->_sgdByteLength = 0;
        if (This->_private->_supercompressionGlobalData) {
            free(This->_private->_supercompressionGlobalData);
            This->_private->_supercompressionGlobalData = NULL;
        }
    }
    ktxTexture2_Destroy(prototype);
    return result;
 }